

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_session.c
# Opt level: O3

char * get_first_line(int state)

{
  char h [32];
  char acStack_70 [64];
  code *pcStack_30;
  char local_28 [40];
  
  local_28[0x10] = '\0';
  local_28[0x11] = '\0';
  local_28[0x12] = '\0';
  local_28[0x13] = '\0';
  local_28[0x14] = '\0';
  local_28[0x15] = '\0';
  local_28[0x16] = '\0';
  local_28[0x17] = '\0';
  local_28[0x18] = '\0';
  local_28[0x19] = '\0';
  local_28[0x1a] = '\0';
  local_28[0x1b] = '\0';
  local_28[0x1c] = '\0';
  local_28[0x1d] = '\0';
  local_28[0x1e] = '\0';
  local_28[0x1f] = '\0';
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  if (state < 400) {
    if (state - 300U < 8) {
      return local_28;
    }
    if (state - 200U < 7) {
      return local_28;
    }
    if (state - 100U < 2) {
      return local_28;
    }
  }
  else if ((state - 400U < 0x12) || (state - 500U < 6)) {
    return local_28;
  }
  pcStack_30 = get_Date_line;
  get_first_line_cold_1();
  get_current_time();
  return acStack_70;
}

Assistant:

char *get_first_line(int state){
    char *head, h[32] = "";
    switch(state){
        case 100: strcat(h, "HTTP/1.1 100 Continue\r\n"); break;
        case 101: strcat(h, "HTTP/1.1 101 Switching Protocols\r\n"); break;
        case 200: strcat(h, "HTTP/1.1 200 OK\r\n");  break;
        case 201: strcat(h, "HTTP/1.1 201 Created\r\n"); break;
        case 202: strcat(h, "HTTP/1.1 202 Accepted\r\n"); break;
        case 203: strcat(h, "HTTP/1.1 203 Non-authoritative Information\\r\n"); break;
        case 204: strcat(h, "HTTP/1.1 204 No Content\r\n"); break;
        case 205: strcat(h, "HTTP/1.1 205 Reset Content\r\n"); break;
        case 206: strcat(h, "HTTP/1.1 206 Partial Content\r\n"); break;
        case 300: strcat(h, "HTTP/1.1 300 Multiple Choices\r\n"); break;
        case 301: strcat(h, "HTTP/1.1 301 Moved Permanently\r\n"); break;
        case 302: strcat(h, "HTTP/1.1 302 Found\r\n"); break;
        case 303: strcat(h, "HTTP/1.1 303 See Other\r\n"); break;
        case 304: strcat(h, "HTTP/1.1 304 Not MOdified\r\n"); break;
        case 305: strcat(h, "HTTP/1.1 305 Use Proxy\r\n"); break;
        case 306: strcat(h, "HTTP/1.1 306 Unused\r\n"); break;
        case 307: strcat(h, "HTTP/1.1 307 Temporary\r\n"); break;
        case 400: strcat(h, "HTTP/1.1 400 Bad Request\r\n"); break;
        case 401: strcat(h, "HTTP/1.1 401 Unauthorized\r\n"); break;
        case 402: strcat(h, "HTTP/1.1 402 Payment Required\r\n"); break;
        case 403: strcat(h, "HTTP/1.1 403 Forbidden\r\n"); break;
        case 404: strcat(h, "HTTP/1.1 404 Not Found\r\n"); break;
        case 405: strcat(h, "HTTP/1.1 405 Mehtod Not Allowed\r\n"); break;
        case 406: strcat(h, "HTTP/1.1 406 Not Acceptable\r\n"); break;
        case 407: strcat(h, "HTTP/1.1 407 Proxy Authentication Required\r\n"); break;
        case 408: strcat(h, "HTTP/1.1 408 Requuest Timeout\r\n"); break;
        case 409: strcat(h, "HTTP/1.1 409 Conflict\r\\n"); break;
        case 410: strcat(h, "HTTP/1.1 410 Gone\r\n"); break;
        case 411: strcat(h, "HTTP/1.1 411 Lenth Require\r\n"); break;
        case 412: strcat(h, "HTTP/1.1 412 Precondition Failed\r\n"); break;
        case 413: strcat(h, "HTTP/1.1 413 Request Entity Too Large\r\n"); break;
        case 414: strcat(h, "HTTP/1.1 414 Request-url Too Long\r\n"); break;
        case 415: strcat(h, "HTTP/1.1 415 Unsupported Media Type\r\n"); break;
        case 416: strcat(h, "HTTP/1.1 416\r\n"); break;
        case 417: strcat(h, "HTTP/1.1 417 Exceptation Failed\r\n"); break;
        case 500: strcat(h, "HTTP/1.1 500 Internal Server Error\r\n"); break;
        case 501: strcat(h, "HTTP/1.1 501 Not Implemented\r\n"); break;
        case 502: strcat(h, "HTTP/1.1 502 Bad Getaway\r\n"); break;
        case 503: strcat(h, "HTTP/1.1 503 Service Unavailable\r\n"); break;
        case 504: strcat(h, "HTTP/1.1 504 Gateway Timeout\r\n"); break;
        case 505: strcat(h, "HTTP/1.1 505 HTTP Version Not Support\r\n"); break;
        default:
            perror("Unknow state code!");
            exit(1);
    }
    head = h;
    return head;
}